

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_line_section.cpp
# Opt level: O0

size_t __thiscall
pstore::repo::debug_line_section_creation_dispatcher::size_bytes
          (debug_line_section_creation_dispatcher *this)

{
  size_t sVar1;
  sources<std::pair<pstore::pointer_based_iterator<const_unsigned_char>,_pstore::pointer_based_iterator<const_unsigned_char>_>,_std::pair<__gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>,_std::pair<__gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>_>
  local_40;
  debug_line_section_creation_dispatcher *local_10;
  debug_line_section_creation_dispatcher *this_local;
  
  local_10 = this;
  section_content::make_sources(&local_40,this->section_);
  sVar1 = debug_line_section::
          size_bytes<std::pair<pstore::pointer_based_iterator<unsigned_char_const>,pstore::pointer_based_iterator<unsigned_char_const>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
                    (&local_40);
  return sVar1;
}

Assistant:

std::size_t debug_line_section_creation_dispatcher::size_bytes () const {
            return debug_line_section::size_bytes (section_->make_sources ());
        }